

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O3

void telnet_send(telnet_t *telnet,char *buffer,size_t size)

{
  size_t sVar1;
  long lVar2;
  char local_5a [2];
  telnet_event_t local_58;
  
  if (size != 0) {
    lVar2 = 0;
    sVar1 = 0;
    do {
      if (buffer[sVar1] == -1) {
        local_58.error.func = (char *)(sVar1 - lVar2);
        if ((char *)local_58.data.size != (char *)0x0) {
          local_58.data.buffer = buffer + lVar2;
          local_58.type = TELNET_EV_SEND;
          (*telnet->eh)(telnet,&local_58,telnet->ud);
        }
        lVar2 = sVar1 + 1;
        local_5a[0] = -1;
        local_5a[1] = -1;
        local_58.type = TELNET_EV_SEND;
        local_58.data.size = 2;
        local_58.data.buffer = local_5a;
        (*telnet->eh)(telnet,&local_58,telnet->ud);
      }
      sVar1 = sVar1 + 1;
    } while (sVar1 != size);
    local_58.error.func = (char *)(size - lVar2);
    if ((char *)local_58.data.size != (char *)0x0) {
      local_58.data.buffer = buffer + lVar2;
      local_58.type = TELNET_EV_SEND;
      (*telnet->eh)(telnet,&local_58,telnet->ud);
    }
  }
  return;
}

Assistant:

void telnet_send(telnet_t *telnet, const char *buffer,
		size_t size) {
	size_t i, l;

	for (l = i = 0; i != size; ++i) {
		/* dump prior portion of text, send escaped bytes */
		if (buffer[i] == (char)TELNET_IAC) {
			/* dump prior text if any */
			if (i != l) {
				_send(telnet, buffer + l, i - l);
			}
			l = i + 1;

			/* send escape */
			telnet_iac(telnet, TELNET_IAC);
		}
	}

	/* send whatever portion of buffer is left */
	if (i != l) {
		_send(telnet, buffer + l, i - l);
	}
}